

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

word Cnf_CutDeriveTruth(Aig_Man_t *p,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = vLeaves->nSize;
  if ((iVar3 < 7) && (0 < vNodes->nSize)) {
    if (vNodes->nSize + iVar3 < 0x101) {
      lVar4 = 0;
      pvVar1 = (void *)0x0;
      for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
        pvVar1 = Vec_PtrEntry(vLeaves,(int)lVar5);
        *(int *)((long)pvVar1 + 0x28) = (int)lVar5;
        *(undefined8 *)((long)Cnf_CutDeriveTruth::S + lVar4) =
             *(undefined8 *)((long)Cnf_CutDeriveTruth::Truth6 + lVar4);
        iVar3 = vLeaves->nSize;
        lVar4 = lVar4 + 8;
      }
      for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
        pvVar1 = Vec_PtrEntry(vNodes,iVar3);
        iVar2 = vLeaves->nSize + iVar3;
        *(int *)((long)pvVar1 + 0x28) = iVar2;
        Cnf_CutDeriveTruth::S[iVar2] =
             (Cnf_CutDeriveTruth::C[(uint)*(ulong *)((long)pvVar1 + 0x10) & 1] ^
             Cnf_CutDeriveTruth::S
             [*(int *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)]) &
             (Cnf_CutDeriveTruth::C[(uint)*(ulong *)((long)pvVar1 + 8) & 1] ^
             Cnf_CutDeriveTruth::S
             [*(int *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x28)]);
      }
      return Cnf_CutDeriveTruth::S[*(int *)((long)pvVar1 + 0x28)];
    }
    __assert_fail("Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) <= 256",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                  ,0x99,"word Cnf_CutDeriveTruth(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Vec_PtrSize(vLeaves) <= 6 && Vec_PtrSize(vNodes) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                ,0x98,"word Cnf_CutDeriveTruth(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

word Cnf_CutDeriveTruth( Aig_Man_t * p, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    static word C[2] = { 0, ~(word)0 };
    static word S[256];
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Vec_PtrSize(vLeaves) <= 6 && Vec_PtrSize(vNodes) > 0 );
    assert( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) <= 256 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
    {
        pObj->iData    = i;
        S[pObj->iData] = Truth6[i];
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        pObj->iData    = Vec_PtrSize(vLeaves) + i;
        S[pObj->iData] = (S[Aig_ObjFanin0(pObj)->iData] ^ C[Aig_ObjFaninC0(pObj)]) & 
                         (S[Aig_ObjFanin1(pObj)->iData] ^ C[Aig_ObjFaninC1(pObj)]);
    }
    return S[pObj->iData];
}